

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O1

TVector2<double> __thiscall
TVector2<double>::Rotated<double>(TVector2<double> *this,TAngle<double> *angle)

{
  double dVar1;
  double *in_RDX;
  double dVar2;
  double dVar3;
  TVector2<double> TVar4;
  
  dVar2 = FFastTrig::cos(&fasttrig,*in_RDX * 11930464.711111112 + 6755399441055744.0);
  dVar3 = FFastTrig::sin(&fasttrig,*in_RDX * 11930464.711111112 + 6755399441055744.0);
  dVar1 = angle->Degrees;
  TVar4.X = dVar3 * dVar1 + dVar2 * angle[1].Degrees;
  this->X = dVar2 * dVar1 - dVar3 * angle[1].Degrees;
  this->Y = TVar4.X;
  TVar4.Y = dVar1;
  return TVar4;
}

Assistant:

TVector2 Rotated(TAngle<T> angle)
	{
		double cosval = angle.Cos();
		double sinval = angle.Sin();
		return TVector2(X*cosval - Y*sinval, Y*cosval + X*sinval);
	}